

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 floatx80_mul_m68k(floatx80 a,floatx80 b,float_status *status)

{
  uint uVar1;
  int32_t zExp;
  uint64_t zSig0;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t zSig1;
  uint uVar7;
  ushort uVar8;
  ulong uVar9;
  bool bVar10;
  floatx80 fVar11;
  
  uVar5 = a.low;
  uVar6 = b.low;
  uVar8 = a.high & 0x7fff;
  bVar10 = ((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0;
  uVar3 = CONCAT71(b.low._1_7_,bVar10);
  if (-1 < (long)uVar5 && bVar10) {
LAB_006c8d22:
    status->float_exception_flags = status->float_exception_flags | 1;
    fVar11._10_6_ = (int6)(uVar3 >> 0x10);
    fVar11.high = 0x7fff;
    fVar11.low = 0xffffffffffffffff;
    return fVar11;
  }
  uVar3 = CONCAT71(b.low._1_7_,-1 < (long)uVar6);
  uVar1 = b._8_4_;
  if (((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)uVar6)
  goto LAB_006c8d22;
  uVar7 = (uint)uVar8;
  uVar2 = uVar1 ^ a._8_4_;
  uVar3 = (ulong)uVar2;
  if (uVar8 == 0x7fff) {
    if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) ||
       (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
        (uVar1 & 0x7fff) == 0x7fff)) {
LAB_006c8d99:
      fVar11 = propagateFloatx80NaN_m68k(a,b,status);
      return fVar11;
    }
    if (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 && uVar6 == 0)
    goto LAB_006c8d22;
  }
  else {
    if ((b.high & 0x7fff) != 0x7fff) {
      if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
        if (uVar5 != 0) {
          uVar3 = 0x3f;
          if (uVar5 != 0) {
            for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          uVar5 = uVar5 << ((byte)(uVar3 ^ 0x3f) & 0x3f);
          uVar7 = 1 - (int)(uVar3 ^ 0x3f);
          goto LAB_006c8dcc;
        }
      }
      else {
LAB_006c8dcc:
        if (((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0) {
          uVar1 = uVar1 & 0x7fff;
LAB_006c8e09:
          uVar9 = (uVar5 & 0xffffffff) * (uVar6 >> 0x20);
          uVar3 = (uVar6 & 0xffffffff) * (uVar5 >> 0x20);
          uVar4 = uVar3 + uVar9;
          zSig1 = uVar6 * uVar5;
          zSig0 = (uVar4 >> 0x20) + (uVar6 >> 0x20) * (uVar5 >> 0x20) +
                  ((ulong)CARRY8(uVar3,uVar9) << 0x20) + (ulong)(zSig1 < uVar4 << 0x20);
          if ((long)zSig0 < 1) {
            zExp = uVar1 + uVar7 + -0x3ffe;
          }
          else {
            zSig0 = zSig0 * 2 | zSig1 >> 0x3f;
            zSig1 = zSig1 * 2;
            zExp = uVar1 + uVar7 + -0x3fff;
          }
          fVar11 = roundAndPackFloatx80_m68k
                             (status->floatx80_rounding_precision,(flag)((uVar2 & 0xffff) >> 0xf),
                              zExp,zSig0,zSig1,status);
          return fVar11;
        }
        if (uVar6 != 0) {
          uVar3 = 0x3f;
          if (uVar6 != 0) {
            for (; uVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          uVar6 = uVar6 << ((byte)(uVar3 ^ 0x3f) & 0x3f);
          uVar1 = 1 - (int)(uVar3 ^ 0x3f);
          goto LAB_006c8e09;
        }
      }
      uVar2 = uVar2 & 0x8000;
      goto LAB_006c8e8e;
    }
    if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0)
    goto LAB_006c8d99;
    if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 && uVar5 == 0)
    goto LAB_006c8d22;
  }
  uVar2 = uVar2 | 0x7fff;
LAB_006c8e8e:
  return (floatx80)(ZEXT416(uVar2) << 0x40);
}

Assistant:

floatx80 floatx80_mul(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig, bSig, zSig0, zSig1;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    bSign = extractFloatx80Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if (    (uint64_t) ( aSig<<1 )
             || ( ( bExp == 0x7FFF ) && (uint64_t) ( bSig<<1 ) ) ) {
            return propagateFloatx80NaN(a, b, status);
        }
        if ( ( bExp | bSig ) == 0 ) goto invalid;
        return packFloatx80(zSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( bExp == 0x7FFF ) {
        if ((uint64_t)(bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        if ( ( aExp | aSig ) == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return floatx80_default_nan(status);
        }
        return packFloatx80(zSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( zSign, 0, 0 );
        normalizeFloatx80Subnormal( aSig, &aExp, &aSig );
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) return packFloatx80( zSign, 0, 0 );
        normalizeFloatx80Subnormal( bSig, &bExp, &bSig );
    }
    zExp = aExp + bExp - 0x3FFE;
    mul64To128( aSig, bSig, &zSig0, &zSig1 );
    if ( 0 < (int64_t) zSig0 ) {
        shortShift128Left( zSig0, zSig1, 1, &zSig0, &zSig1 );
        --zExp;
    }
    return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                zSign, zExp, zSig0, zSig1, status);
}